

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# field_impl.h
# Opt level: O1

void secp256k1_fe_cmov(secp256k1_fe *r,secp256k1_fe *a,int flag)

{
  secp256k1_fe *r_00;
  uint64_t uVar1;
  uint64_t uVar2;
  undefined8 a_00;
  int iVar3;
  uint uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  long lVar10;
  ulong uVar11;
  long lVar12;
  long lVar13;
  secp256k1_gej *psVar14;
  secp256k1_gej *psVar15;
  secp256k1_gej *a_01;
  secp256k1_modinv64_modinfo *modinfo;
  secp256k1_gej *psVar16;
  secp256k1_gej *psVar17;
  secp256k1_gej *a_02;
  ulong uVar18;
  long lVar19;
  ulong uVar20;
  uint64_t *puVar21;
  long lVar22;
  ulong uVar23;
  long lVar24;
  secp256k1_gej *psVar25;
  undefined1 *unaff_R13;
  ulong uVar26;
  uint64_t uVar27;
  undefined1 *puVar28;
  bool bVar29;
  undefined1 auVar30 [16];
  int vflag;
  unsigned_long _zzq_result;
  unsigned_long _zzq_args [6];
  secp256k1_gej *psStack_318;
  secp256k1_gej *psStack_310;
  uint64_t uStack_2f8;
  uint64_t uStack_2f0;
  ulong uStack_2e8;
  ulong uStack_2e0;
  ulong uStack_2d8;
  undefined1 auStack_2d0 [96];
  ulong uStack_270;
  secp256k1_gej *psStack_268;
  undefined1 auStack_260 [56];
  ulong uStack_228;
  ulong uStack_220;
  secp256k1_gej *psStack_218;
  undefined1 auStack_210 [96];
  secp256k1_gej *psStack_1b0;
  undefined1 *puStack_1a8;
  secp256k1_gej *psStack_1a0;
  undefined1 *puStack_198;
  code *pcStack_190;
  secp256k1_gej *psStack_188;
  secp256k1_gej *psStack_178;
  undefined1 auStack_168 [152];
  undefined8 uStack_d0;
  secp256k1_fe sStack_a8;
  
  if ((uint)flag < 2) {
    secp256k1_fe_verify(a);
    secp256k1_fe_verify(r);
    uVar6 = (long)flag - 1;
    uVar5 = -(long)flag;
    r->n[0] = a->n[0] & uVar5 | r->n[0] & uVar6;
    r->n[1] = a->n[1] & uVar5 | r->n[1] & uVar6;
    r->n[2] = a->n[2] & uVar5 | r->n[2] & uVar6;
    r->n[3] = a->n[3] & uVar5 | r->n[3] & uVar6;
    r->n[4] = uVar5 & a->n[4] | uVar6 & r->n[4];
    if (r->magnitude < a->magnitude) {
      r->magnitude = a->magnitude;
    }
    if (a->normalized == 0) {
      r->normalized = 0;
    }
    secp256k1_fe_verify(r);
    return;
  }
  secp256k1_fe_cmov_cold_1();
  psVar25 = (secp256k1_gej *)0x1000003d0;
  secp256k1_gej_verify((secp256k1_gej *)r);
  secp256k1_fe_verify(a);
  secp256k1_fe_verify(a);
  uVar6 = (a->n[4] >> 0x30) * 0x1000003d1 + a->n[0];
  if (((uVar6 & 0xfffffffffffff) != 0xffffefffffc2f) && ((uVar6 & 0xfffffffffffff) != 0)) {
LAB_00145469:
    secp256k1_fe_sqr(&sStack_a8,a);
    secp256k1_fe_mul(r,r,&sStack_a8);
    r_00 = &((secp256k1_gej *)r)->y;
    secp256k1_fe_mul(r_00,r_00,&sStack_a8);
    secp256k1_fe_mul(r_00,r_00,a);
    secp256k1_fe_mul(&((secp256k1_gej *)r)->z,&((secp256k1_gej *)r)->z,a);
    secp256k1_gej_verify((secp256k1_gej *)r);
    return;
  }
  uVar5 = (uVar6 >> 0x34) + a->n[1];
  psVar14 = (secp256k1_gej *)((uVar5 >> 0x34) + a->n[2]);
  psVar17 = (secp256k1_gej *)(((ulong)psVar14 >> 0x34) + a->n[3]);
  uVar18 = ((ulong)psVar17 >> 0x34) + (a->n[4] & 0xffffffffffff);
  if ((((uVar5 | uVar6 | (ulong)psVar14 | (ulong)psVar17) & 0xfffffffffffff) != 0 || uVar18 != 0) &&
     (((uVar6 | 0x1000003d0) & uVar5 & (ulong)psVar14 & (ulong)psVar17 & (uVar18 ^ 0xf000000000000))
      != 0xfffffffffffff)) goto LAB_00145469;
  secp256k1_gej_rescale_cold_1();
  uStack_d0 = 0x1000003d0;
  a_01 = (secp256k1_gej *)auStack_168;
  a_02 = (secp256k1_gej *)auStack_168;
  puVar28 = auStack_168;
  auStack_168._144_8_ = r;
  secp256k1_gej_verify(psVar14);
  psVar17->infinity = psVar14->infinity;
  secp256k1_fe_mul(&psVar17->z,&psVar14->z,&psVar14->y);
  secp256k1_fe_sqr((secp256k1_fe *)auStack_168,&psVar14->y);
  psVar16 = (secp256k1_gej *)(auStack_168 + 0x60);
  psVar15 = psVar14;
  secp256k1_fe_sqr((secp256k1_fe *)psVar16,&psVar14->x);
  secp256k1_fe_verify((secp256k1_fe *)psVar16);
  if ((int)auStack_168._136_4_ < 0xb) {
    auStack_168._136_4_ = auStack_168._136_4_ * 3;
    psVar15 = (secp256k1_gej *)(auStack_168 + 0x60);
    auStack_168._96_8_ = auStack_168._96_8_ * 3;
    auStack_168._104_8_ = auStack_168._104_8_ * 3;
    auStack_168._112_8_ = auStack_168._112_8_ * 3;
    auStack_168._120_8_ = auStack_168._120_8_ * 3;
    auStack_168._128_8_ = auStack_168._128_8_ * 3;
    auStack_168._140_4_ = 0;
    secp256k1_fe_verify((secp256k1_fe *)psVar15);
    secp256k1_fe_half((secp256k1_fe *)psVar15);
    secp256k1_fe_verify((secp256k1_fe *)auStack_168);
    secp256k1_fe_verify_magnitude((secp256k1_fe *)auStack_168,1);
    auStack_168._48_8_ = 0x3ffffbfffff0bc - auStack_168._0_8_;
    auStack_168._56_8_ = 0x3ffffffffffffc - auStack_168._8_8_;
    psVar25 = (secp256k1_gej *)(auStack_168 + 0x30);
    auStack_168._64_8_ = 0x3ffffffffffffc - auStack_168._16_8_;
    auStack_168._72_8_ = 0x3ffffffffffffc - auStack_168._24_8_;
    auStack_168._80_8_ = 0x3fffffffffffc - auStack_168._32_8_;
    auStack_168._88_8_ = 2;
    secp256k1_fe_verify((secp256k1_fe *)psVar25);
    secp256k1_fe_mul((secp256k1_fe *)psVar25,(secp256k1_fe *)psVar25,&psVar14->x);
    secp256k1_fe_sqr(&psVar17->x,(secp256k1_fe *)psVar15);
    secp256k1_fe_verify(&psVar17->x);
    psVar16 = psVar25;
    secp256k1_fe_verify((secp256k1_fe *)psVar25);
    iVar3 = auStack_168._88_4_ + (psVar17->x).magnitude;
    unaff_R13 = auStack_168;
    if (0x20 < iVar3) goto LAB_00145835;
    uVar27 = (psVar17->x).n[1];
    uVar1 = (psVar17->x).n[2];
    uVar2 = (psVar17->x).n[3];
    psVar14 = (secp256k1_gej *)(auStack_168 + 0x30);
    (psVar17->x).n[0] = (psVar17->x).n[0] + auStack_168._48_8_;
    (psVar17->x).n[1] = uVar27 + auStack_168._56_8_;
    (psVar17->x).n[2] = uVar1 + auStack_168._64_8_;
    (psVar17->x).n[3] = uVar2 + auStack_168._72_8_;
    puVar21 = (psVar17->x).n + 4;
    *puVar21 = *puVar21 + auStack_168._80_8_;
    (psVar17->x).magnitude = iVar3;
    (psVar17->x).normalized = 0;
    secp256k1_fe_verify(&psVar17->x);
    secp256k1_fe_verify(&psVar17->x);
    psVar16 = psVar14;
    secp256k1_fe_verify((secp256k1_fe *)psVar14);
    iVar3 = auStack_168._88_4_ + (psVar17->x).magnitude;
    unaff_R13 = auStack_168;
    if (0x20 < iVar3) goto LAB_0014583a;
    uVar27 = (psVar17->x).n[1];
    uVar1 = (psVar17->x).n[2];
    uVar2 = (psVar17->x).n[3];
    psVar14 = (secp256k1_gej *)(auStack_168 + 0x30);
    (psVar17->x).n[0] = (psVar17->x).n[0] + auStack_168._48_8_;
    (psVar17->x).n[1] = uVar27 + auStack_168._56_8_;
    (psVar17->x).n[2] = uVar1 + auStack_168._64_8_;
    (psVar17->x).n[3] = uVar2 + auStack_168._72_8_;
    puVar21 = (psVar17->x).n + 4;
    *puVar21 = *puVar21 + auStack_168._80_8_;
    (psVar17->x).magnitude = iVar3;
    (psVar17->x).normalized = 0;
    secp256k1_fe_verify(&psVar17->x);
    secp256k1_fe_sqr((secp256k1_fe *)auStack_168,(secp256k1_fe *)auStack_168);
    secp256k1_fe_verify((secp256k1_fe *)psVar14);
    psVar16 = psVar17;
    secp256k1_fe_verify(&psVar17->x);
    uVar4 = (psVar17->x).magnitude + auStack_168._88_4_;
    unaff_R13 = auStack_168;
    if (0x20 < (int)uVar4) goto LAB_0014583f;
    a_01 = (secp256k1_gej *)(auStack_168 + 0x30);
    auStack_168._48_8_ = (psVar17->x).n[0] + auStack_168._48_8_;
    auStack_168._56_8_ = (psVar17->x).n[1] + auStack_168._56_8_;
    auStack_168._64_8_ = (psVar17->x).n[2] + auStack_168._64_8_;
    auStack_168._72_8_ = (psVar17->x).n[3] + auStack_168._72_8_;
    auStack_168._80_8_ = auStack_168._80_8_ + (psVar17->x).n[4];
    auStack_168._92_4_ = 0;
    auStack_168._88_4_ = uVar4;
    secp256k1_fe_verify((secp256k1_fe *)a_01);
    psVar14 = (secp256k1_gej *)&psVar17->y;
    secp256k1_fe_mul((secp256k1_fe *)psVar14,(secp256k1_fe *)a_01,
                     (secp256k1_fe *)(auStack_168 + 0x60));
    secp256k1_fe_verify((secp256k1_fe *)psVar14);
    secp256k1_fe_verify((secp256k1_fe *)auStack_168);
    iVar3 = auStack_168._40_4_ + (psVar17->y).magnitude;
    unaff_R13 = auStack_168;
    if (iVar3 < 0x21) {
      uVar27 = (psVar17->y).n[1];
      uVar1 = (psVar17->y).n[2];
      uVar2 = (psVar17->y).n[3];
      (psVar17->y).n[0] = (psVar17->y).n[0] + auStack_168._0_8_;
      (psVar17->y).n[1] = uVar27 + auStack_168._8_8_;
      (psVar17->y).n[2] = uVar1 + auStack_168._16_8_;
      (psVar17->y).n[3] = uVar2 + auStack_168._24_8_;
      puVar21 = (psVar17->y).n + 4;
      *puVar21 = *puVar21 + auStack_168._32_8_;
      (psVar17->y).magnitude = iVar3;
      (psVar17->y).normalized = 0;
      secp256k1_fe_verify((secp256k1_fe *)psVar14);
      secp256k1_fe_verify((secp256k1_fe *)psVar14);
      secp256k1_fe_verify_magnitude((secp256k1_fe *)psVar14,2);
      uVar27 = (psVar17->y).n[1];
      uVar1 = (psVar17->y).n[2];
      uVar2 = (psVar17->y).n[3];
      (psVar17->y).n[0] = 0x5ffff9ffffe91a - (psVar17->y).n[0];
      (psVar17->y).n[1] = 0x5ffffffffffffa - uVar27;
      (psVar17->y).n[2] = 0x5ffffffffffffa - uVar1;
      (psVar17->y).n[3] = 0x5ffffffffffffa - uVar2;
      (psVar17->y).n[4] = 0x5fffffffffffa - (psVar17->y).n[4];
      (psVar17->y).magnitude = 3;
      (psVar17->y).normalized = 0;
      secp256k1_fe_verify((secp256k1_fe *)psVar14);
      secp256k1_gej_verify(psVar17);
      return;
    }
  }
  else {
    secp256k1_gej_double_cold_5();
LAB_00145835:
    secp256k1_gej_double_cold_4();
LAB_0014583a:
    a_01 = psVar15;
    secp256k1_gej_double_cold_3();
LAB_0014583f:
    a_02 = psVar16;
    puVar28 = auStack_168 + 0x60;
    secp256k1_gej_double_cold_2();
  }
  secp256k1_gej_double_cold_1();
  uVar6 = (ulong)a_01 & 0xffffffff;
  psStack_188 = (secp256k1_gej *)0x145856;
  psVar16 = a_02;
  psStack_178 = psVar17;
  secp256k1_fe_verify(&a_02->x);
  if ((uint)a_01 < 0x21) {
    iVar3 = (a_02->x).magnitude * (uint)a_01;
    if (iVar3 < 0x21) {
      (a_02->x).n[0] = (a_02->x).n[0] * uVar6;
      (a_02->x).n[1] = (a_02->x).n[1] * uVar6;
      (a_02->x).n[2] = (a_02->x).n[2] * uVar6;
      (a_02->x).n[3] = (a_02->x).n[3] * uVar6;
      (a_02->x).n[4] = uVar6 * (a_02->x).n[4];
      (a_02->x).magnitude = iVar3;
      (a_02->x).normalized = 0;
      secp256k1_fe_verify(&a_02->x);
      return;
    }
  }
  else {
    psStack_188 = (secp256k1_gej *)0x1458bc;
    secp256k1_fe_mul_int_unchecked_cold_2();
  }
  psStack_188 = (secp256k1_gej *)secp256k1_fe_half;
  secp256k1_fe_mul_int_unchecked_cold_1();
  pcStack_190 = (code *)0x1458ca;
  psStack_188 = a_02;
  secp256k1_fe_verify(&psVar16->x);
  pcStack_190 = (code *)0x1458d7;
  psVar17 = psVar16;
  secp256k1_fe_verify_magnitude(&psVar16->x,0x1f);
  modinfo = (secp256k1_modinv64_modinfo *)(psVar16->x).n[0];
  uVar5 = -(ulong)((uint)modinfo & 1);
  uVar18 = uVar5 >> 0xc;
  uVar8 = (long)(modinfo->modulus).v + (uVar18 & 0xffffefffffc2f);
  if ((uVar8 & 1) == 0) {
    uVar6 = (uVar5 >> 0x10) + (psVar16->x).n[4];
    uVar9 = uVar18 + (psVar16->x).n[3];
    uVar4 = (uint)(uVar5 >> 0x2c);
    auVar30._0_8_ = CONCAT44(uVar4,(int)uVar18);
    auVar30._8_4_ = (int)uVar18;
    auVar30._12_4_ = uVar4;
    uVar5 = auVar30._0_8_ + (psVar16->x).n[1];
    uVar18 = auVar30._8_8_ + (psVar16->x).n[2];
    (psVar16->x).n[0] = ((ulong)((uint)uVar5 & 1) << 0x33) + (uVar8 >> 1);
    (psVar16->x).n[1] = ((uVar18 & 1) << 0x33) + (uVar5 >> 1);
    (psVar16->x).n[2] = ((uVar9 & 1) << 0x33) + (uVar18 >> 1);
    (psVar16->x).n[3] = ((ulong)((uint)uVar6 & 1) << 0x33) + (uVar9 >> 1);
    (psVar16->x).n[4] = uVar6 >> 1;
    (psVar16->x).magnitude = ((psVar16->x).magnitude >> 1) + 1;
    (psVar16->x).normalized = 0;
    secp256k1_fe_verify(&psVar16->x);
    return;
  }
  pcStack_190 = secp256k1_modinv64;
  secp256k1_fe_half_cold_1();
  uVar8 = 0;
  auStack_210._16_8_ = 0;
  auStack_210._24_8_ = 0;
  auStack_210._0_8_ = 0;
  auStack_210._8_8_ = 0;
  auStack_210._32_8_ = 0;
  auStack_210._56_8_ = 0;
  auStack_210._80_8_ = 0;
  auStack_210._64_8_ = 0;
  auStack_210._72_8_ = 0;
  auStack_210._48_8_ = 1;
  auStack_2d0._32_8_ = (modinfo->modulus).v[4];
  auStack_2d0._0_8_ = (modinfo->modulus).v[0];
  uStack_2e0 = (modinfo->modulus).v[1];
  uStack_2e8 = (modinfo->modulus).v[2];
  auStack_2d0._24_8_ = (modinfo->modulus).v[3];
  auStack_260._0_8_ = (psVar17->x).n[0];
  uStack_2f0 = (psVar17->x).n[1];
  uStack_2f8 = (psVar17->x).n[2];
  uStack_2d8 = (psVar17->x).n[3];
  uVar27 = (psVar17->x).n[4];
  uVar9 = 0xffffffffffffffff;
  uVar5 = auStack_2d0._0_8_;
  uVar18 = auStack_260._0_8_;
  psVar15 = (secp256k1_gej *)auStack_2d0._32_8_;
  psStack_310 = (secp256k1_gej *)auStack_2d0._24_8_;
  auStack_2d0._8_8_ = uStack_2e0;
  auStack_2d0._16_8_ = uStack_2e8;
  auStack_2d0._48_8_ = psVar17;
  auStack_260._8_8_ = uStack_2f0;
  auStack_260._16_8_ = uStack_2f8;
  auStack_260._24_8_ = uStack_2d8;
  auStack_260._32_8_ = uVar27;
  auStack_210._88_8_ = psVar16;
  psStack_1b0 = psVar25;
  puStack_1a8 = unaff_R13;
  psStack_1a0 = psVar14;
  puStack_198 = puVar28;
  pcStack_190 = (code *)uVar6;
  do {
    uVar26 = 8;
    lVar10 = 3;
    uVar6 = 0;
    uVar23 = 0;
    psVar25 = (secp256k1_gej *)0x8;
    psStack_318 = (secp256k1_gej *)0x8;
    uVar7 = uVar18;
    uVar11 = uVar5;
    do {
      auStack_2d0._72_8_ = uVar8;
      auStack_2d0._80_8_ = uVar27;
      auStack_2d0._88_8_ = psVar15;
      if ((uVar11 & 1) == 0) {
        secp256k1_modinv64_cold_29();
LAB_00146478:
        secp256k1_modinv64_cold_1();
LAB_0014647d:
        secp256k1_modinv64_cold_2();
LAB_00146482:
        secp256k1_modinv64_cold_28();
        goto LAB_00146487;
      }
      psVar17 = (secp256k1_gej *)(uVar6 * uVar18 + uVar26 * uVar5);
      psVar25 = (secp256k1_gej *)(uVar11 << ((byte)lVar10 & 0x3f));
      if (psVar17 != psVar25) goto LAB_00146478;
      psVar17 = (secp256k1_gej *)((long)psStack_318 * uVar18 + uVar23 * uVar5);
      psVar25 = (secp256k1_gej *)(uVar7 << ((byte)lVar10 & 0x3f));
      if (psVar17 != psVar25) goto LAB_0014647d;
      psVar25 = (secp256k1_gej *)((long)uVar9 >> 0x3f);
      uStack_270 = (ulong)((uint)uVar7 & 1);
      uVar20 = -uStack_270;
      psVar17 = (secp256k1_gej *)((ulong)psVar25 & uVar20);
      psStack_268 = psVar25;
      if ((uVar9 ^ (ulong)psVar17) - 0x251 < 0xfffffffffffffb61) goto LAB_00146482;
      uVar9 = (uVar9 ^ (ulong)psVar17) - 1;
      psStack_318 = (secp256k1_gej *)
                    ((long)(psStack_318->x).n + (((ulong)psVar25 ^ uVar6) - (long)psVar25 & uVar20))
      ;
      uVar6 = (uVar6 + ((ulong)psStack_318 & (ulong)psVar17)) * 2;
      uVar23 = uVar23 + (((ulong)psVar25 ^ uVar26) - (long)psVar25 & uVar20);
      uVar26 = (uVar26 + (uVar23 & (ulong)psVar17)) * 2;
      uVar20 = (((ulong)psVar25 ^ uVar11) - (long)psVar25 & uVar20) + uVar7;
      uVar7 = uVar20 >> 1;
      uVar11 = uVar11 + (uVar20 & (ulong)psVar17);
      lVar10 = lVar10 + 1;
    } while (lVar10 != 0x3e);
    psVar25 = (secp256k1_gej *)(uVar6 * uVar23);
    psVar17 = psStack_318;
    auStack_260._48_8_ = uVar26;
    uStack_228 = uVar6;
    uStack_220 = uVar23;
    psStack_218 = psStack_318;
    if ((SUB168(SEXT816((long)uVar26) * SEXT816((long)psStack_318),8) -
        SUB168(SEXT816((long)uVar6) * SEXT816((long)uVar23),8)) -
        (ulong)((secp256k1_gej *)(uVar26 * (long)psStack_318) < psVar25) != 2 ||
        (long)(uVar26 * (long)psStack_318) - (long)psVar25 != 0) {
LAB_00146487:
      secp256k1_modinv64_cold_3();
LAB_0014648c:
      secp256k1_modinv64_cold_27();
LAB_00146491:
      secp256k1_modinv64_cold_26();
LAB_00146496:
      psVar14 = psVar17;
      secp256k1_modinv64_cold_25();
LAB_0014649b:
      secp256k1_modinv64_cold_24();
LAB_001464a0:
      secp256k1_modinv64_cold_4();
LAB_001464a5:
      secp256k1_modinv64_cold_5();
LAB_001464aa:
      secp256k1_modinv64_cold_6();
LAB_001464af:
      secp256k1_modinv64_cold_7();
LAB_001464b4:
      secp256k1_modinv64_cold_8();
LAB_001464b9:
      secp256k1_modinv64_cold_9();
LAB_001464be:
      secp256k1_modinv64_cold_10();
LAB_001464c3:
      secp256k1_modinv64_cold_11();
LAB_001464c8:
      secp256k1_modinv64_cold_12();
LAB_001464cd:
      secp256k1_modinv64_cold_13();
LAB_001464d2:
      secp256k1_modinv64_cold_14();
LAB_001464d7:
      secp256k1_modinv64_cold_15();
LAB_001464dc:
      secp256k1_modinv64_cold_23();
      psVar16 = psVar25;
LAB_001464e1:
      secp256k1_modinv64_cold_22();
      psVar17 = psVar14;
LAB_001464e6:
      psVar15 = psVar17;
      secp256k1_modinv64_cold_21();
LAB_001464eb:
      secp256k1_modinv64_cold_20();
LAB_001464f0:
      psVar17 = psVar15;
      secp256k1_modinv64_cold_19();
LAB_001464f5:
      secp256k1_modinv64_cold_18();
      goto LAB_001464fa;
    }
    secp256k1_modinv64_update_de_62
              ((secp256k1_modinv64_signed62 *)auStack_210,
               (secp256k1_modinv64_signed62 *)(auStack_210 + 0x30),
               (secp256k1_modinv64_trans2x2 *)(auStack_260 + 0x30),modinfo);
    psVar17 = (secp256k1_gej *)auStack_2d0;
    psVar25 = (secp256k1_gej *)0x5;
    iVar3 = secp256k1_modinv64_mul_cmp_62
                      ((secp256k1_modinv64_signed62 *)psVar17,5,&modinfo->modulus,-1);
    if (iVar3 < 1) goto LAB_0014648c;
    psVar17 = (secp256k1_gej *)auStack_2d0;
    psVar25 = (secp256k1_gej *)0x5;
    iVar3 = secp256k1_modinv64_mul_cmp_62
                      ((secp256k1_modinv64_signed62 *)psVar17,5,&modinfo->modulus,1);
    if (0 < iVar3) goto LAB_00146491;
    psVar14 = (secp256k1_gej *)auStack_260;
    psVar25 = (secp256k1_gej *)0x5;
    psVar17 = psVar14;
    iVar3 = secp256k1_modinv64_mul_cmp_62
                      ((secp256k1_modinv64_signed62 *)psVar14,5,&modinfo->modulus,-1);
    if (iVar3 < 1) goto LAB_00146496;
    psVar25 = (secp256k1_gej *)0x5;
    iVar3 = secp256k1_modinv64_mul_cmp_62
                      ((secp256k1_modinv64_signed62 *)psVar14,5,&modinfo->modulus,1);
    if (-1 < iVar3) goto LAB_0014649b;
    psVar14 = (secp256k1_gej *)(uVar26 * uVar5);
    psVar25 = SUB168(SEXT816((long)uVar26) * SEXT816((long)uVar5),8);
    uVar8 = uVar6 * uVar18;
    lVar10 = SUB168(SEXT816((long)uVar6) * SEXT816((long)uVar18),8);
    if ((-1 < lVar10) &&
       (uVar7 = (ulong)((secp256k1_gej *)(-1 - uVar8) < psVar14),
       lVar12 = (0x7fffffffffffffff - lVar10) - (long)psVar25,
       (SBORROW8(0x7fffffffffffffff - lVar10,(long)psVar25) != SBORROW8(lVar12,uVar7)) !=
       (long)(lVar12 - uVar7) < 0)) goto LAB_001464a0;
    puVar21 = (uint64_t *)((long)(psVar14->x).n + uVar8);
    lVar10 = (long)(psVar25->x).n + (ulong)CARRY8(uVar8,(ulong)psVar14) + lVar10;
    psVar14 = (secp256k1_gej *)(uVar23 * uVar5);
    psVar25 = SUB168(SEXT816((long)uVar23) * SEXT816((long)uVar5),8);
    uVar5 = (long)psStack_318 * uVar18;
    lVar12 = SUB168(SEXT816((long)psStack_318) * SEXT816((long)uVar18),8);
    if ((-1 < lVar12) &&
       (uVar18 = (ulong)((secp256k1_gej *)(-1 - uVar5) < psVar14),
       lVar13 = (0x7fffffffffffffff - lVar12) - (long)psVar25,
       (SBORROW8(0x7fffffffffffffff - lVar12,(long)psVar25) != SBORROW8(lVar13,uVar18)) !=
       (long)(lVar13 - uVar18) < 0)) goto LAB_001464a5;
    bVar29 = CARRY8((ulong)psVar14,uVar5);
    psVar14 = (secp256k1_gej *)((long)(psVar14->x).n + uVar5);
    psVar25 = (secp256k1_gej *)((long)(psVar25->x).n + (ulong)bVar29 + lVar12);
    if (((ulong)puVar21 & 0x3ffffffffffffffe) != 0) goto LAB_001464aa;
    if (((ulong)psVar14 & 0x3fffffffffffffff) != 0) goto LAB_001464af;
    uVar5 = (ulong)puVar21 >> 0x3e | lVar10 * 4;
    uVar8 = uStack_2e0 * uVar26 + uVar5;
    lVar19 = SUB168(SEXT816((long)uStack_2e0) * SEXT816((long)uVar26),8) + (lVar10 >> 0x3e) +
             (ulong)CARRY8(uStack_2e0 * uVar26,uVar5);
    uVar18 = uStack_2f0 * uVar6;
    lVar13 = SUB168(SEXT816((long)uStack_2f0) * SEXT816((long)uVar6),8);
    uVar5 = (ulong)(-uVar18 - 1 < uVar8);
    lVar10 = (0x7fffffffffffffff - lVar13) - lVar19;
    lVar22 = (-0x8000000000000000 - lVar13) - (ulong)(uVar18 != 0);
    lVar12 = lVar19 - lVar22;
    bVar29 = (SBORROW8(0x7fffffffffffffff - lVar13,lVar19) != SBORROW8(lVar10,uVar5)) ==
             (long)(lVar10 - uVar5) < 0;
    if (lVar13 < 0) {
      bVar29 = (SBORROW8(lVar19,lVar22) != SBORROW8(lVar12,(ulong)(uVar8 < -uVar18))) ==
               (long)(lVar12 - (ulong)(uVar8 < -uVar18)) < 0;
    }
    if (!bVar29) goto LAB_001464b4;
    uVar5 = (ulong)psVar14 >> 0x3e | (long)psVar25 * 4;
    uVar11 = uStack_2e0 * uVar23 + uVar5;
    lVar12 = SUB168(SEXT816((long)uStack_2e0) * SEXT816((long)uVar23),8) + ((long)psVar25 >> 0x3e) +
             (ulong)CARRY8(uStack_2e0 * uVar23,uVar5);
    uVar7 = uStack_2f0 * (long)psStack_318;
    psVar14 = SUB168(SEXT816((long)uStack_2f0) * SEXT816((long)psStack_318),8);
    uVar5 = (ulong)(-uVar7 - 1 < uVar11);
    lVar10 = (0x7fffffffffffffff - (long)psVar14) - lVar12;
    psVar25 = (secp256k1_gej *)((-0x8000000000000000 - (long)psVar14) - (ulong)(uVar7 != 0));
    bVar29 = (SBORROW8(0x7fffffffffffffff - (long)psVar14,lVar12) != SBORROW8(lVar10,uVar5)) ==
             (long)(lVar10 - uVar5) < 0;
    if ((long)psVar14 < 0) {
      bVar29 = (SBORROW8(lVar12,(long)psVar25) !=
               SBORROW8(lVar12 - (long)psVar25,(ulong)(uVar11 < -uVar7))) ==
               (long)((lVar12 - (long)psVar25) - (ulong)(uVar11 < -uVar7)) < 0;
    }
    if (!bVar29) goto LAB_001464b9;
    lVar10 = lVar13 + lVar19 + (ulong)CARRY8(uVar18,uVar8);
    psVar14 = (secp256k1_gej *)((long)(psVar14->x).n + (ulong)CARRY8(uVar7,uVar11) + lVar12);
    uVar5 = lVar10 * 4 | uVar18 + uVar8 >> 0x3e;
    auStack_2d0._0_8_ = uVar18 + uVar8 & 0x3fffffffffffffff;
    auStack_2d0._64_8_ = uVar7 + uVar11 & 0x3fffffffffffffff;
    uVar8 = uStack_2e8 * uVar26 + uVar5;
    lVar12 = (lVar10 >> 0x3e) + SUB168(SEXT816((long)uStack_2e8) * SEXT816((long)uVar26),8) +
             (ulong)CARRY8(uStack_2e8 * uVar26,uVar5);
    uVar18 = uStack_2f8 * uVar6;
    lVar13 = SUB168(SEXT816((long)uStack_2f8) * SEXT816((long)uVar6),8);
    uVar5 = (ulong)(-uVar18 - 1 < uVar8);
    lVar10 = (0x7fffffffffffffff - lVar13) - lVar12;
    psVar25 = (secp256k1_gej *)((-0x8000000000000000 - lVar13) - (ulong)(uVar18 != 0));
    bVar29 = (SBORROW8(0x7fffffffffffffff - lVar13,lVar12) != SBORROW8(lVar10,uVar5)) ==
             (long)(lVar10 - uVar5) < 0;
    if (lVar13 < 0) {
      bVar29 = (SBORROW8(lVar12,(long)psVar25) !=
               SBORROW8(lVar12 - (long)psVar25,(ulong)(uVar8 < -uVar18))) ==
               (long)((lVar12 - (long)psVar25) - (ulong)(uVar8 < -uVar18)) < 0;
    }
    auStack_260._0_8_ = auStack_2d0._64_8_;
    if (!bVar29) goto LAB_001464be;
    uVar5 = uVar7 + uVar11 >> 0x3e | (long)psVar14 * 4;
    uVar11 = uStack_2e8 * uVar23 + uVar5;
    psVar25 = (secp256k1_gej *)
              (SUB168(SEXT816((long)uStack_2e8) * SEXT816((long)uVar23),8) + ((long)psVar14 >> 0x3e)
              + (ulong)CARRY8(uStack_2e8 * uVar23,uVar5));
    uVar7 = uStack_2f8 * (long)psStack_318;
    lVar22 = SUB168(SEXT816((long)uStack_2f8) * SEXT816((long)psStack_318),8);
    uVar5 = (ulong)(-uVar7 - 1 < uVar11);
    lVar10 = (0x7fffffffffffffff - lVar22) - (long)psVar25;
    lVar24 = (-0x8000000000000000 - lVar22) - (ulong)(uVar7 != 0);
    lVar19 = (long)psVar25 - lVar24;
    bVar29 = (SBORROW8(0x7fffffffffffffff - lVar22,(long)psVar25) != SBORROW8(lVar10,uVar5)) ==
             (long)(lVar10 - uVar5) < 0;
    if (lVar22 < 0) {
      bVar29 = (SBORROW8((long)psVar25,lVar24) != SBORROW8(lVar19,(ulong)(uVar11 < -uVar7))) ==
               (long)(lVar19 - (ulong)(uVar11 < -uVar7)) < 0;
    }
    psVar14 = (secp256k1_gej *)(ulong)bVar29;
    auStack_2d0._56_8_ = auStack_2d0._0_8_;
    if (bVar29 == false) goto LAB_001464c3;
    lVar10 = lVar12 + lVar13 + (ulong)CARRY8(uVar8,uVar18);
    psVar25 = (secp256k1_gej *)((long)(psVar25->x).n + (ulong)CARRY8(uVar11,uVar7) + lVar22);
    uVar5 = lVar10 * 4 | uVar8 + uVar18 >> 0x3e;
    uStack_2e0 = uVar8 + uVar18 & 0x3fffffffffffffff;
    uStack_2f0 = uVar11 + uVar7 & 0x3fffffffffffffff;
    uVar8 = (long)psStack_310 * uVar26 + uVar5;
    lVar12 = (lVar10 >> 0x3e) + SUB168(SEXT816((long)psStack_310) * SEXT816((long)uVar26),8) +
             (ulong)CARRY8((long)psStack_310 * uVar26,uVar5);
    uVar18 = uStack_2d8 * uVar6;
    lVar13 = SUB168(SEXT816((long)uStack_2d8) * SEXT816((long)uVar6),8);
    uVar5 = (ulong)(-uVar18 - 1 < uVar8);
    lVar10 = (0x7fffffffffffffff - lVar13) - lVar12;
    psVar14 = (secp256k1_gej *)((-0x8000000000000000 - lVar13) - (ulong)(uVar18 != 0));
    bVar29 = (SBORROW8(0x7fffffffffffffff - lVar13,lVar12) != SBORROW8(lVar10,uVar5)) ==
             (long)(lVar10 - uVar5) < 0;
    if (lVar13 < 0) {
      bVar29 = (SBORROW8(lVar12,(long)psVar14) !=
               SBORROW8(lVar12 - (long)psVar14,(ulong)(uVar8 < -uVar18))) ==
               (long)((lVar12 - (long)psVar14) - (ulong)(uVar8 < -uVar18)) < 0;
    }
    auStack_2d0._8_8_ = uStack_2e0;
    auStack_260._8_8_ = uStack_2f0;
    if (!bVar29) goto LAB_001464c8;
    uVar5 = uVar11 + uVar7 >> 0x3e | (long)psVar25 * 4;
    uVar11 = (long)psStack_310 * uVar23 + uVar5;
    psVar14 = (secp256k1_gej *)
              (SUB168(SEXT816((long)psStack_310) * SEXT816((long)uVar23),8) +
               ((long)psVar25 >> 0x3e) + (ulong)CARRY8((long)psStack_310 * uVar23,uVar5));
    uVar7 = uStack_2d8 * (long)psStack_318;
    lVar22 = SUB168(SEXT816((long)uStack_2d8) * SEXT816((long)psStack_318),8);
    uVar5 = (ulong)(-uVar7 - 1 < uVar11);
    lVar10 = (0x7fffffffffffffff - lVar22) - (long)psVar14;
    lVar24 = (-0x8000000000000000 - lVar22) - (ulong)(uVar7 != 0);
    lVar19 = (long)psVar14 - lVar24;
    bVar29 = (SBORROW8(0x7fffffffffffffff - lVar22,(long)psVar14) != SBORROW8(lVar10,uVar5)) ==
             (long)(lVar10 - uVar5) < 0;
    if (lVar22 < 0) {
      bVar29 = (SBORROW8((long)psVar14,lVar24) != SBORROW8(lVar19,(ulong)(uVar11 < -uVar7))) ==
               (long)(lVar19 - (ulong)(uVar11 < -uVar7)) < 0;
    }
    psVar25 = (secp256k1_gej *)(ulong)bVar29;
    if (bVar29 == false) goto LAB_001464cd;
    lVar10 = lVar12 + lVar13 + (ulong)CARRY8(uVar8,uVar18);
    psVar14 = (secp256k1_gej *)((long)(psVar14->x).n + (ulong)CARRY8(uVar11,uVar7) + lVar22);
    uVar5 = lVar10 * 4 | uVar8 + uVar18 >> 0x3e;
    uStack_2e8 = uVar8 + uVar18 & 0x3fffffffffffffff;
    uStack_2f8 = uVar11 + uVar7 & 0x3fffffffffffffff;
    uVar18 = auStack_2d0._88_8_ * uVar26 + uVar5;
    lVar13 = (lVar10 >> 0x3e) + SUB168(SEXT816((long)auStack_2d0._88_8_) * SEXT816((long)uVar26),8)
             + (ulong)CARRY8(auStack_2d0._88_8_ * uVar26,uVar5);
    uVar5 = auStack_2d0._80_8_ * uVar6;
    psVar25 = SUB168(SEXT816((long)auStack_2d0._80_8_) * SEXT816((long)uVar6),8);
    uVar6 = (ulong)(-uVar5 - 1 < uVar18);
    lVar10 = (0x7fffffffffffffff - (long)psVar25) - lVar13;
    lVar19 = (-0x8000000000000000 - (long)psVar25) - (ulong)(uVar5 != 0);
    lVar12 = lVar13 - lVar19;
    bVar29 = (SBORROW8(0x7fffffffffffffff - (long)psVar25,lVar13) != SBORROW8(lVar10,uVar6)) ==
             (long)(lVar10 - uVar6) < 0;
    if ((long)psVar25 < 0) {
      bVar29 = (SBORROW8(lVar13,lVar19) != SBORROW8(lVar12,(ulong)(uVar18 < -uVar5))) ==
               (long)(lVar12 - (ulong)(uVar18 < -uVar5)) < 0;
    }
    auStack_2d0._16_8_ = uStack_2e8;
    auStack_260._16_8_ = uStack_2f8;
    if (!bVar29) goto LAB_001464d2;
    uVar6 = uVar11 + uVar7 >> 0x3e | (long)psVar14 * 4;
    uVar26 = auStack_2d0._88_8_ * uVar23 + uVar6;
    lVar22 = SUB168(SEXT816((long)auStack_2d0._88_8_) * SEXT816((long)uVar23),8) +
             ((long)psVar14 >> 0x3e) + (ulong)CARRY8(auStack_2d0._88_8_ * uVar23,uVar6);
    uVar8 = auStack_2d0._80_8_ * (long)psStack_318;
    lVar19 = SUB168(SEXT816((long)auStack_2d0._80_8_) * SEXT816((long)psStack_318),8);
    uVar6 = (ulong)(-uVar8 - 1 < uVar26);
    lVar10 = (0x7fffffffffffffff - lVar19) - lVar22;
    lVar24 = (-0x8000000000000000 - lVar19) - (ulong)(uVar8 != 0);
    lVar12 = lVar22 - lVar24;
    bVar29 = (SBORROW8(0x7fffffffffffffff - lVar19,lVar22) != SBORROW8(lVar10,uVar6)) ==
             (long)(lVar10 - uVar6) < 0;
    if (lVar19 < 0) {
      bVar29 = (SBORROW8(lVar22,lVar24) != SBORROW8(lVar12,(ulong)(uVar26 < -uVar8))) ==
               (long)(lVar12 - (ulong)(uVar26 < -uVar8)) < 0;
    }
    psVar14 = (secp256k1_gej *)(ulong)bVar29;
    if (bVar29 == false) goto LAB_001464d7;
    lVar10 = (long)(psVar25->x).n + (ulong)CARRY8(uVar18,uVar5) + lVar13;
    lVar12 = lVar22 + lVar19 + (ulong)CARRY8(uVar26,uVar8);
    psVar25 = (secp256k1_gej *)(lVar10 * 4 | uVar18 + uVar5 >> 0x3e);
    psVar14 = (secp256k1_gej *)(uVar18 + uVar5 & 0x3fffffffffffffff);
    uStack_2d8 = uVar26 + uVar8 & 0x3fffffffffffffff;
    auStack_2d0._24_8_ = psVar14;
    auStack_260._24_8_ = uStack_2d8;
    if ((lVar10 >> 0x3e) + -1 + (ulong)((secp256k1_gej *)0x7fffffffffffffff < psVar25) != -1)
    goto LAB_001464dc;
    uVar27 = uVar26 + uVar8 >> 0x3e | lVar12 * 4;
    psVar16 = psVar25;
    auStack_2d0._32_8_ = psVar25;
    if ((lVar12 >> 0x3e) + -1 + (ulong)(0x7fffffffffffffff < uVar27) != -1) goto LAB_001464e1;
    psVar15 = (secp256k1_gej *)auStack_2d0;
    psVar16 = (secp256k1_gej *)0x5;
    psVar17 = psVar15;
    auStack_260._32_8_ = uVar27;
    iVar3 = secp256k1_modinv64_mul_cmp_62
                      ((secp256k1_modinv64_signed62 *)psVar15,5,&modinfo->modulus,-1);
    if (iVar3 < 1) goto LAB_001464e6;
    psVar16 = (secp256k1_gej *)0x5;
    iVar3 = secp256k1_modinv64_mul_cmp_62
                      ((secp256k1_modinv64_signed62 *)psVar15,5,&modinfo->modulus,1);
    if (0 < iVar3) goto LAB_001464eb;
    psVar17 = (secp256k1_gej *)auStack_260;
    psVar16 = (secp256k1_gej *)0x5;
    psVar15 = psVar17;
    iVar3 = secp256k1_modinv64_mul_cmp_62
                      ((secp256k1_modinv64_signed62 *)psVar17,5,&modinfo->modulus,-1);
    if (iVar3 < 1) goto LAB_001464f0;
    psVar16 = (secp256k1_gej *)0x5;
    iVar3 = secp256k1_modinv64_mul_cmp_62
                      ((secp256k1_modinv64_signed62 *)psVar17,5,&modinfo->modulus,1);
    if (-1 < iVar3) goto LAB_001464f5;
    uVar4 = (int)auStack_2d0._72_8_ + 1;
    uVar8 = (ulong)uVar4;
    uVar5 = auStack_2d0._56_8_;
    uVar18 = auStack_2d0._64_8_;
    psVar15 = psVar25;
    psStack_310 = psVar14;
  } while (uVar4 != 10);
  psVar17 = (secp256k1_gej *)auStack_260;
  psVar16 = (secp256k1_gej *)0x5;
  iVar3 = secp256k1_modinv64_mul_cmp_62
                    ((secp256k1_modinv64_signed62 *)psVar17,5,&SECP256K1_SIGNED62_ONE,0);
  if (iVar3 == 0) {
    iVar3 = secp256k1_modinv64_mul_cmp_62
                      ((secp256k1_modinv64_signed62 *)auStack_2d0,5,&SECP256K1_SIGNED62_ONE,-1);
    a_00 = auStack_2d0._48_8_;
    if (iVar3 != 0) {
      iVar3 = secp256k1_modinv64_mul_cmp_62
                        ((secp256k1_modinv64_signed62 *)auStack_2d0,5,&SECP256K1_SIGNED62_ONE,1);
      if (iVar3 != 0) {
        psVar16 = (secp256k1_gej *)0x5;
        psVar17 = (secp256k1_gej *)a_00;
        iVar3 = secp256k1_modinv64_mul_cmp_62
                          ((secp256k1_modinv64_signed62 *)a_00,5,&SECP256K1_SIGNED62_ONE,0);
        if (iVar3 == 0) {
          psVar17 = (secp256k1_gej *)auStack_210;
          psVar16 = (secp256k1_gej *)0x5;
          iVar3 = secp256k1_modinv64_mul_cmp_62
                            ((secp256k1_modinv64_signed62 *)psVar17,5,&SECP256K1_SIGNED62_ONE,0);
          if (iVar3 == 0) {
            psVar17 = (secp256k1_gej *)auStack_2d0;
            psVar16 = (secp256k1_gej *)0x5;
            iVar3 = secp256k1_modinv64_mul_cmp_62
                              ((secp256k1_modinv64_signed62 *)psVar17,5,&modinfo->modulus,1);
            if (iVar3 == 0) goto LAB_00146431;
          }
        }
        goto LAB_001464ff;
      }
    }
LAB_00146431:
    secp256k1_modinv64_normalize_62
              ((secp256k1_modinv64_signed62 *)auStack_210,auStack_2d0._32_8_,modinfo);
    ((secp256k1_fe *)a_00)->n[4] = auStack_210._32_8_;
    ((secp256k1_fe *)a_00)->n[2] = auStack_210._16_8_;
    ((secp256k1_fe *)a_00)->n[3] = auStack_210._24_8_;
    ((secp256k1_fe *)a_00)->n[0] = auStack_210._0_8_;
    ((secp256k1_fe *)a_00)->n[1] = auStack_210._8_8_;
    return;
  }
LAB_001464fa:
  secp256k1_modinv64_cold_16();
LAB_001464ff:
  secp256k1_modinv64_cold_17();
  uVar8 = (ulong)((uint)(psVar16->x).n[0] & 1);
  uVar9 = -uVar8;
  secp256k1_scalar_verify((secp256k1_scalar *)psVar16);
  uVar6 = (psVar16->x).n[1] << 0x3f | (psVar16->x).n[0] >> 1;
  (psVar17->x).n[0] = uVar6 + (uVar9 & 0xdfe92f46681b20a1);
  uVar18 = (psVar16->x).n[2] << 0x3f | (psVar16->x).n[1] >> 1;
  uVar6 = (ulong)CARRY8(uVar9 & 0xdfe92f46681b20a1,uVar6);
  uVar5 = (uVar9 & 0x5d576e7357a4501d) + uVar18;
  bVar29 = CARRY8(uVar9 & 0x5d576e7357a4501d,uVar18) || CARRY8(uVar5,uVar6);
  (psVar17->x).n[1] = uVar5 + uVar6;
  uVar6 = (psVar16->x).n[3] << 0x3f | (psVar16->x).n[2] >> 1;
  (psVar17->x).n[2] = (uVar6 - uVar8) + (ulong)bVar29;
  (psVar17->x).n[3] =
       (uVar9 & 0x7fffffffffffffff) + ((psVar16->x).n[3] >> 1) +
       (ulong)(CARRY8(uVar6,uVar9) || CARRY8(uVar6 + uVar9,(ulong)bVar29));
  secp256k1_scalar_verify((secp256k1_scalar *)psVar17);
  return;
}

Assistant:

SECP256K1_INLINE static void secp256k1_fe_cmov(secp256k1_fe *r, const secp256k1_fe *a, int flag) {
    VERIFY_CHECK(flag == 0 || flag == 1);
    SECP256K1_FE_VERIFY(a);
    SECP256K1_FE_VERIFY(r);

    secp256k1_fe_impl_cmov(r, a, flag);
    if (a->magnitude > r->magnitude) r->magnitude = a->magnitude;
    if (!a->normalized) r->normalized = 0;

    SECP256K1_FE_VERIFY(r);
}